

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_key_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  sxi32 rc;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_array(apArg[1]);
    if (iVar1 == 0) {
      jx9_result_bool(pCtx,0);
    }
    else {
      sVar2 = jx9HashmapLookup((jx9_hashmap *)(apArg[1]->x).pOther,*apArg,(jx9_hashmap_node **)0x0);
      jx9_result_bool(pCtx,(uint)(sVar2 == 0));
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_key_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)apArg[1]->x.pOther, apArg[0], 0);
	/* lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK ? 1 : 0);
	return JX9_OK;
}